

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O2

void __thiscall
t_rb_generator::generate_rb_struct
          (t_rb_generator *this,t_rb_ofstream *out,t_struct *tstruct,bool is_exception)

{
  undefined1 *puVar1;
  t_rb_ofstream *ptVar2;
  ostream *poVar3;
  t_rb_generator *this_00;
  string local_50;
  
  generate_rdoc(this,out,(t_doc *)tstruct);
  ptVar2 = t_rb_ofstream::indent(out);
  poVar3 = std::operator<<((ostream *)ptVar2,"class ");
  type_name_abi_cxx11_(&local_50,this,&tstruct->super_t_type);
  std::operator<<(poVar3,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (is_exception) {
    std::operator<<((ostream *)out," < ::Thrift::Exception");
    std::operator<<((ostream *)out,(string *)&::endl_abi_cxx11_);
    puVar1 = &(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8;
    *(int *)puVar1 = *(int *)puVar1 + 1;
    ptVar2 = t_rb_ofstream::indent(out);
    this_00 = (t_rb_generator *)
              std::operator<<((ostream *)ptVar2,"include ::Thrift::Struct, ::Thrift::Struct_Union");
    std::operator<<((ostream *)this_00,(string *)&::endl_abi_cxx11_);
    generate_rb_simple_exception_constructor(this_00,out,tstruct);
  }
  else {
    std::operator<<((ostream *)out,(string *)&::endl_abi_cxx11_);
    puVar1 = &(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8;
    *(int *)puVar1 = *(int *)puVar1 + 1;
    ptVar2 = t_rb_ofstream::indent(out);
    poVar3 = std::operator<<((ostream *)ptVar2,"include ::Thrift::Struct, ::Thrift::Struct_Union");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  generate_field_constants(this,out,tstruct);
  generate_field_defns(this,out,tstruct);
  generate_rb_struct_required_validator(this,out,tstruct);
  ptVar2 = t_rb_ofstream::indent(out);
  poVar3 = std::operator<<((ostream *)ptVar2,"::Thrift::Struct.generate_accessors self");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  puVar1 = &(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8;
  *(int *)puVar1 = *(int *)puVar1 + -1;
  ptVar2 = t_rb_ofstream::indent(out);
  poVar3 = std::operator<<((ostream *)ptVar2,"end");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_rb_generator::generate_rb_struct(t_rb_ofstream& out,
                                        t_struct* tstruct,
                                        bool is_exception = false) {
  generate_rdoc(out, tstruct);
  out.indent() << "class " << type_name(tstruct);
  if (is_exception) {
    out << " < ::Thrift::Exception";
  }
  out << endl;

  out.indent_up();
  out.indent() << "include ::Thrift::Struct, ::Thrift::Struct_Union" << endl;

  if (is_exception) {
    generate_rb_simple_exception_constructor(out, tstruct);
  }

  generate_field_constants(out, tstruct);
  generate_field_defns(out, tstruct);
  generate_rb_struct_required_validator(out, tstruct);

  out.indent() << "::Thrift::Struct.generate_accessors self" << endl;

  out.indent_down();
  out.indent() << "end" << endl << endl;
}